

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ResetQueryPool
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t firstQuery,uint32_t queryCount)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_48;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,queryCount));
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ResetQueryPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x286);
    std::__cxx11::string::~string((string *)&local_48);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdResetQueryPool)(this->m_VkCmdBuffer,queryPool,firstQuery,queryCount);
  return;
}

Assistant:

__forceinline void ResetQueryPool(VkQueryPool queryPool,
                                      uint32_t    firstQuery,
                                      uint32_t    queryCount)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Query pool reset must be performed outside of render pass (17.2).
        EndRenderScope();
        FlushBarriers();
        vkCmdResetQueryPool(m_VkCmdBuffer, queryPool, firstQuery, queryCount);
    }